

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

float If_CutAverageRefs(If_Man_t *p,If_Cut_t *pCut)

{
  byte bVar1;
  If_Obj_t *pIVar2;
  int iVar3;
  ulong uVar4;
  
  uVar4 = 0;
  iVar3 = 0;
  do {
    bVar1 = pCut->field_0x1f;
    if (bVar1 <= uVar4) {
LAB_006f1909:
      return (float)iVar3 / (float)bVar1;
    }
    pIVar2 = If_ManObj(p,(int)(&pCut[1].Area)[uVar4]);
    if (pIVar2 == (If_Obj_t *)0x0) {
      bVar1 = pCut->field_0x1f;
      goto LAB_006f1909;
    }
    iVar3 = iVar3 + pIVar2->nRefs;
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

float If_CutAverageRefs( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    int nRefsTotal, i;
    nRefsTotal = 0;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        nRefsTotal += pLeaf->nRefs;
    return ((float)nRefsTotal)/pCut->nLeaves;
}